

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * __thiscall czh::utils::to_str<int&>(string *__return_storage_ptr__,utils *this,int *a)

{
  int *a_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,*(int *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string to_str(T &&a)
  {
    return std::to_string(std::forward<T>(a));
  }